

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int file_read_privatekey
              (LIBSSH2_SESSION *session,LIBSSH2_HOSTKEY_METHOD **hostkey_method,
              void **hostkey_abstract,uchar *method,size_t method_len,char *privkeyfile,
              char *passphrase)

{
  int iVar1;
  LIBSSH2_HOSTKEY_METHOD **ppLVar2;
  char *errmsg;
  LIBSSH2_HOSTKEY_METHOD *pLVar3;
  
  ppLVar2 = libssh2_hostkey_methods();
  *hostkey_method = (LIBSSH2_HOSTKEY_METHOD *)0x0;
  *hostkey_abstract = (void *)0x0;
  pLVar3 = *ppLVar2;
  while (pLVar3 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    ppLVar2 = ppLVar2 + 1;
    if (pLVar3->name == (char *)0x0) break;
    if ((pLVar3->initPEM != (_func_int_LIBSSH2_SESSION_ptr_char_ptr_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar1 = strncmp(pLVar3->name,(char *)method,method_len), iVar1 == 0)) {
      *hostkey_method = pLVar3;
      goto LAB_0012cfa9;
    }
    pLVar3 = *ppLVar2;
  }
  pLVar3 = *hostkey_method;
  if (pLVar3 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    errmsg = "No handler for specified private key";
    iVar1 = -0x11;
  }
  else {
LAB_0012cfa9:
    iVar1 = (*pLVar3->initPEM)(session,privkeyfile,(uchar *)passphrase,hostkey_abstract);
    if (iVar1 == 0) {
      return 0;
    }
    errmsg = "Unable to initialize private key from file";
    iVar1 = -0x10;
  }
  iVar1 = _libssh2_error(session,iVar1,errmsg);
  return iVar1;
}

Assistant:

static int
file_read_privatekey(LIBSSH2_SESSION * session,
                     const LIBSSH2_HOSTKEY_METHOD ** hostkey_method,
                     void **hostkey_abstract,
                     const unsigned char *method, size_t method_len,
                     const char *privkeyfile, const char *passphrase)
{
    const LIBSSH2_HOSTKEY_METHOD **hostkey_methods_avail =
        libssh2_hostkey_methods();

    _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                   "Loading private key file: %s", privkeyfile));
    *hostkey_method = NULL;
    *hostkey_abstract = NULL;
    while(*hostkey_methods_avail && (*hostkey_methods_avail)->name) {
        if((*hostkey_methods_avail)->initPEM
            && strncmp((*hostkey_methods_avail)->name, (const char *) method,
                       method_len) == 0) {
            *hostkey_method = *hostkey_methods_avail;
            break;
        }
        hostkey_methods_avail++;
    }
    if(!*hostkey_method) {
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NONE,
                              "No handler for specified private key");
    }

    if((*hostkey_method)->
        initPEM(session, privkeyfile, (const unsigned char *) passphrase,
                hostkey_abstract)) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to initialize private key from file");
    }

    return 0;
}